

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

vrna_md_t * vrna_md_copy(vrna_md_t *md_to,vrna_md_t *md_from)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  vrna_md_t *__dest;
  long lVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  byte bVar12;
  
  bVar12 = 0;
  if (md_from == (vrna_md_t *)0x0) {
    __dest = (vrna_md_t *)0x0;
  }
  else {
    __dest = md_to;
    if (md_to == (vrna_md_t *)0x0) {
      __dest = (vrna_md_t *)vrna_alloc(0x7e8);
    }
    if (md_to != md_from) {
      memcpy(__dest,md_from,0x7e8);
      uVar1 = *(undefined8 *)md_from->rtype;
      uVar2 = *(undefined8 *)(md_from->rtype + 2);
      uVar3 = *(undefined8 *)(md_from->rtype + 6);
      *(undefined8 *)(__dest->rtype + 4) = *(undefined8 *)(md_from->rtype + 4);
      *(undefined8 *)(__dest->rtype + 6) = uVar3;
      *(undefined8 *)__dest->rtype = uVar1;
      *(undefined8 *)(__dest->rtype + 2) = uVar2;
      uVar1 = *(undefined8 *)md_from->alias;
      uVar2 = *(undefined8 *)(md_from->alias + 4);
      uVar3 = *(undefined8 *)(md_from->alias + 0xc);
      uVar4 = *(undefined8 *)(md_from->alias + 0xd);
      uVar5 = *(undefined8 *)(md_from->alias + 0x11);
      *(undefined8 *)(__dest->alias + 8) = *(undefined8 *)(md_from->alias + 8);
      *(undefined8 *)(__dest->alias + 0xc) = uVar3;
      *(undefined8 *)__dest->alias = uVar1;
      *(undefined8 *)(__dest->alias + 4) = uVar2;
      *(undefined8 *)(__dest->alias + 0xd) = uVar4;
      *(undefined8 *)(__dest->alias + 0x11) = uVar5;
      uVar1 = *(undefined8 *)md_from->nonstandards;
      uVar2 = *(undefined8 *)(md_from->nonstandards + 8);
      uVar3 = *(undefined8 *)(md_from->nonstandards + 0x10);
      uVar4 = *(undefined8 *)(md_from->nonstandards + 0x18);
      uVar5 = *(undefined8 *)(md_from->nonstandards + 0x20);
      uVar6 = *(undefined8 *)(md_from->nonstandards + 0x28);
      uVar7 = *(undefined8 *)(md_from->nonstandards + 0x38);
      *(undefined8 *)(__dest->nonstandards + 0x30) = *(undefined8 *)(md_from->nonstandards + 0x30);
      *(undefined8 *)(__dest->nonstandards + 0x38) = uVar7;
      *(undefined8 *)(__dest->nonstandards + 0x20) = uVar5;
      *(undefined8 *)(__dest->nonstandards + 0x28) = uVar6;
      *(undefined8 *)__dest->nonstandards = uVar1;
      *(undefined8 *)(__dest->nonstandards + 8) = uVar2;
      *(undefined8 *)(__dest->nonstandards + 0x10) = uVar3;
      *(undefined8 *)(__dest->nonstandards + 0x18) = uVar4;
      for (lVar9 = 0x104; lVar9 != 0x7e8; lVar9 = lVar9 + 0x54) {
        pcVar10 = md_from->nonstandards + lVar9 + -0x48;
        pcVar11 = __dest->nonstandards + lVar9 + -0x48;
        for (lVar8 = 0x15; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined4 *)pcVar11 = *(undefined4 *)pcVar10;
          pcVar10 = pcVar10 + ((ulong)bVar12 * -2 + 1) * 4;
          pcVar11 = pcVar11 + ((ulong)bVar12 * -2 + 1) * 4;
        }
      }
    }
  }
  return __dest;
}

Assistant:

PUBLIC vrna_md_t *
vrna_md_copy(vrna_md_t        *md_to,
             const vrna_md_t  *md_from)
{
  int       i;
  vrna_md_t *md;

  md = NULL;

  /* only process if md_from is non-NULL */
  if (md_from) {
    if (!md_to)
      /* create container to be filled */
      md = (vrna_md_t *)vrna_alloc(sizeof(vrna_md_t));
    else
      /* or directly write to target */
      md = md_to;

    /* check if not the same object */
    if (md_to != md_from) {
      /* copy simple members */
      memcpy(md, md_from, sizeof(vrna_md_t));
      /* copy arrays */
      memcpy(md->rtype, &(md_from->rtype[0]), 8 * sizeof(int));
      memcpy(md->alias, &(md_from->alias[0]), (MAXALPHA + 1) * sizeof(short));
      memcpy(md->nonstandards, &(md_from->nonstandards[0]), 64 * sizeof(char));
      /* copy matrices */
      for (i = 0; i <= MAXALPHA; i++)
        memcpy(md->pair[i], (md_from->pair[i]), (MAXALPHA + 1) * sizeof(int));
    }
  }

  return md;
}